

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O1

vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
ear::GainCalculatorDirectSpeakersImpl::_findCandidates
          (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,GainCalculatorDirectSpeakersImpl *this,PolarSpeakerPosition *pos,
          bool isLfe,double tol)

{
  pointer *pppVar1;
  double start;
  double end;
  double dVar2;
  type tVar3;
  pointer pCVar4;
  _Alloc_hider _Var5;
  long lVar6;
  iterator __position;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *pvVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  PolarSpeakerPosition *pPVar11;
  double *pdVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  double dVar19;
  Channel channel;
  RowVector3d cartPosition;
  double local_210;
  pair<int,_double> local_1b8;
  Vector3d local_1a8;
  double local_188;
  double dStack_180;
  double local_178;
  char local_170;
  type local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  char local_150;
  type local_148;
  undefined8 uStack_140;
  char local_138;
  type local_130;
  undefined8 uStack_128;
  undefined1 local_120;
  double *local_118;
  double adStack_110 [3];
  undefined1 local_f8 [128];
  dummy_u local_78;
  bool local_58;
  dummy_u local_50;
  
  pPVar11 = pos;
  pdVar12 = (double *)local_f8;
  for (lVar8 = 0xf; lVar8 != 0; lVar8 = lVar8 + -1) {
    *pdVar12 = pPVar11->azimuth;
    pPVar11 = (PolarSpeakerPosition *)&pPVar11->azimuthMin;
    pdVar12 = pdVar12 + 1;
  }
  local_f8[0x78] = false;
  bVar14 = (pos->screenEdgeLock).horizontal.super_type.m_initialized == true;
  if (bVar14) {
    local_78.aligner_ = (type)((long)local_f8 + 0x90);
    tVar3 = (pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_.aligner_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_f8 + 0x80),tVar3,
               *(long *)((long)&(pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_ + 8) +
               (long)tVar3);
  }
  local_58 = false;
  bVar15 = (pos->screenEdgeLock).vertical.super_type.m_initialized == true;
  local_f8[0x78] = bVar14;
  if (bVar15) {
    local_50.aligner_ = (type)((long)local_f8 + 0xb8);
    tVar3 = (pos->screenEdgeLock).vertical.super_type.m_storage.dummy_.aligner_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_f8 + 0xa8),tVar3,
               *(long *)((long)&(pos->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 8) +
               (long)tVar3);
  }
  local_58 = bVar15;
  toCartesianVector3d(&local_1a8,(PolarSpeakerPosition *)local_f8);
  local_118 = (double *)
              local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0];
  adStack_110[0] =
       local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1];
  adStack_110[1] =
       local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2];
  if (local_58 == true) {
    if (local_50.aligner_ != (type)((long)local_f8 + 0xb8)) {
      operator_delete((void *)local_50.aligner_,local_50._16_8_ + 1);
    }
    local_58 = false;
  }
  if (local_f8[0x78] == true) {
    if (local_78.aligner_ != (type)((long)local_f8 + 0x90)) {
      operator_delete((void *)local_78.aligner_,local_78._16_8_ + 1);
    }
    local_f8[0x78] = false;
  }
  pdVar12 = local_118;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < this->_nChannels) {
    local_210 = pos->distance;
    uVar16 = SUB84(local_210,0);
    uVar17 = (undefined4)((ulong)local_210 >> 0x20);
    if ((pos->distanceMax).super_type.m_initialized != false) {
      local_210 = (pos->distanceMax).super_type.m_storage;
    }
    if ((pos->distanceMin).super_type.m_initialized != false) {
      dVar18 = (pos->distanceMin).super_type.m_storage;
      uVar16 = SUB84(dVar18,0);
      uVar17 = (undefined4)((ulong)dVar18 >> 0x20);
    }
    dVar18 = pos->elevation;
    dVar19 = dVar18;
    if ((pos->elevationMax).super_type.m_initialized != false) {
      dVar19 = (pos->elevationMax).super_type.m_storage;
    }
    if ((pos->elevationMin).super_type.m_initialized != false) {
      dVar18 = (pos->elevationMin).super_type.m_storage;
    }
    start = (&pos->azimuth)[(ulong)(pos->azimuthMin).super_type.m_initialized * 2];
    end = (&pos->azimuth)[(ulong)(pos->azimuthMax).super_type.m_initialized * 4];
    lVar13 = 0;
    lVar8 = 0;
    do {
      pvVar7 = Layout::channels(&this->_layout);
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (double)(local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array + 2);
      pCVar4 = (pvVar7->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
               super__Vector_impl_data._M_start;
      _Var5._M_p = pCVar4[lVar8]._name._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a8,_Var5._M_p,_Var5._M_p + pCVar4[lVar8]._name._M_string_length);
      local_178 = pCVar4[lVar8]._polarPosition.distance;
      local_188 = pCVar4[lVar8]._polarPosition.azimuth;
      dStack_180 = pCVar4[lVar8]._polarPosition.elevation;
      local_170 = pCVar4[lVar8]._polarPositionNominal.super_type.m_initialized == true;
      if ((bool)local_170) {
        local_158 = *(undefined8 *)
                     ((long)&pCVar4[lVar8]._polarPositionNominal.super_type.m_storage + 0x10);
        local_168 = pCVar4[lVar8]._polarPositionNominal.super_type.m_storage.dummy_.aligner_;
        uStack_160 = *(undefined8 *)
                      ((long)&pCVar4[lVar8]._polarPositionNominal.super_type.m_storage + 8);
      }
      local_150 = pCVar4[lVar8]._azimuthRange.super_type.m_initialized == true;
      if ((bool)local_150) {
        local_148 = pCVar4[lVar8]._azimuthRange.super_type.m_storage.dummy_.aligner_;
        uStack_140 = *(undefined8 *)((long)&pCVar4[lVar8]._azimuthRange.super_type.m_storage + 8);
      }
      local_138 = pCVar4[lVar8]._elevationRange.super_type.m_initialized == true;
      if ((bool)local_138) {
        local_130 = pCVar4[lVar8]._elevationRange.super_type.m_storage.dummy_.aligner_;
        uStack_128 = *(undefined8 *)((long)&pCVar4[lVar8]._elevationRange.super_type.m_storage + 8);
      }
      local_120 = pCVar4[lVar8]._isLfe;
      if ((this->_isLfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows <= lVar8) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x19a,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Array<bool, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Array<bool, -1, 1>, Level = 1]"
                     );
      }
      if ((this->_isLfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
          m_data[lVar8] == isLfe) {
        if ((this->_azimuths).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows <= lVar8) goto LAB_0014eb41;
        bVar14 = insideAngleRange((this->_azimuths).
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data[lVar8],start,end,tol);
        if (!bVar14) {
          if ((this->_elevations).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows <= lVar8) goto LAB_0014eb41;
          if (ABS((this->_elevations).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  .m_storage.m_data[lVar8]) < 90.0 - tol) goto LAB_0014eabd;
        }
        if ((this->_elevations).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows <= lVar8) {
LAB_0014eb41:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        dVar2 = (this->_elevations).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data[lVar8];
        if ((dVar18 - tol < dVar2) && (dVar2 < dVar19 + tol)) {
          if ((this->_distances).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows <= lVar8) goto LAB_0014eb41;
          dVar2 = (this->_distances).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data[lVar8];
          if (((double)CONCAT44(uVar17,uVar16) - tol < dVar2) && (dVar2 < local_210 + tol)) {
            pdVar9 = (this->_positions).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_data;
            lVar10 = (this->_positions).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_cols;
            if (lVar10 < 0 && pdVar9 != (double *)0x0) {
              __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                            ,0xb2,
                            "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
                           );
            }
            lVar6 = (this->_positions).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_rows;
            if (lVar6 <= lVar8) {
              __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                            ,0x7a,
                            "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                           );
            }
            if (lVar10 != 3) {
              __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                            "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseBinaryOp.h"
                            ,0x74,
                            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, const Eigen::Matrix<double, 1, 3>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Rhs = const Eigen::Matrix<double, 1, 3>]"
                           );
            }
            local_1b8.second = (pdVar9[lVar8] - (double)pdVar12) * (pdVar9[lVar8] - (double)pdVar12)
            ;
            pdVar9 = (double *)(lVar13 + lVar6 * 8 + (long)pdVar9);
            lVar10 = 0;
            do {
              local_1b8.second =
                   local_1b8.second +
                   (*pdVar9 - adStack_110[lVar10]) * (*pdVar9 - adStack_110[lVar10]);
              lVar10 = lVar10 + 1;
              pdVar9 = pdVar9 + lVar6;
            } while (lVar10 != 2);
            local_1b8.second = SQRT(local_1b8.second);
            local_1b8.first = (int)lVar8;
            __position._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
              _M_realloc_insert<std::pair<int,double>>
                        ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                         __return_storage_ptr__,__position,&local_1b8);
            }
            else {
              *(ulong *)__position._M_current = CONCAT44(local_1b8._4_4_,local_1b8.first);
              (__position._M_current)->second = local_1b8.second;
              pppVar1 = &(__return_storage_ptr__->
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
            }
          }
        }
      }
LAB_0014eabd:
      if (local_138 == '\x01') {
        local_138 = '\0';
      }
      if (local_150 == '\x01') {
        local_150 = '\0';
      }
      if (local_170 == '\x01') {
        local_170 = '\0';
      }
      if ((double *)
          local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] !=
          local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array + 2) {
        operator_delete((void *)local_1a8.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[0],
                        (long)local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                              .m_storage.m_data.array[2] + 1);
      }
      lVar8 = lVar8 + 1;
      lVar13 = lVar13 + 8;
    } while (lVar8 < this->_nChannels);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<int, double>>
  GainCalculatorDirectSpeakersImpl::_findCandidates(
      const PolarSpeakerPosition& pos, bool isLfe, double tol) {
    Eigen::RowVector3d cartPosition = toCartesianVector3d(pos);
    std::vector<std::pair<int, double>> candidates;
    double azMin = boost::get_optional_value_or(pos.azimuthMin, pos.azimuth);
    double azMax = boost::get_optional_value_or(pos.azimuthMax, pos.azimuth);
    double elMin =
        boost::get_optional_value_or(pos.elevationMin, pos.elevation);
    double elMax =
        boost::get_optional_value_or(pos.elevationMax, pos.elevation);
    double distMin =
        boost::get_optional_value_or(pos.distanceMin, pos.distance);
    double distMax =
        boost::get_optional_value_or(pos.distanceMax, pos.distance);
    for (int i = 0; i < _nChannels; ++i) {
      Channel channel = _layout.channels()[i];
      if (isLfe == _isLfe[i]) {
        if ((insideAngleRange(_azimuths(i), azMin, azMax, tol) ||
             std::abs(_elevations(i)) >= 90.0 - tol) &&
            (_elevations(i) > elMin - tol) && (_elevations(i) < elMax + tol) &&
            (_distances(i) > distMin - tol) &&
            (_distances(i) < distMax + tol)) {
          double distance = (_positions.row(i) - cartPosition).norm();
          candidates.push_back(std::make_pair(i, distance));
        }
      }
    }
    return candidates;
  }